

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

void ** adt_ary_set(adt_ary_t *self,int32_t s32Index,void *pElem)

{
  void *pElem_local;
  int32_t s32Index_local;
  adt_ary_t *self_local;
  
  if (self == (adt_ary_t *)0x0) {
    self_local = (adt_ary_t *)0x0;
  }
  else {
    pElem_local._4_4_ = s32Index;
    if (s32Index < 0) {
      if (self->s32CurLen < -s32Index) {
        return (void **)0x0;
      }
      pElem_local._4_4_ = self->s32CurLen + s32Index;
    }
    adt_ary_fill(self,pElem_local._4_4_ + 1);
    self->pFirst[pElem_local._4_4_] = pElem;
    self_local = (adt_ary_t *)(self->pFirst + pElem_local._4_4_);
  }
  return &self_local->ppAlloc;
}

Assistant:

void**	adt_ary_set(adt_ary_t *self, int32_t s32Index, void *pElem){
	if(self==0){
		return (void**)0;
	}
	if(s32Index<0){
		s32Index = (-s32Index);
		if(s32Index > (self->s32CurLen) ){
			//negative index outside array bounds
			return (void**) 0;
		}
		//negative index inside array bounds
		s32Index=self->s32CurLen-s32Index;
	}
	adt_ary_fill(self,((int32_t) s32Index)+1);
	self->pFirst[s32Index]=pElem;
	return &self->pFirst[s32Index];
}